

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteToConsoleListener.cpp
# Opt level: O1

shared_ptr<Common::WriteToConsoleListener> Common::WriteToConsoleListener::instance(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  shared_ptr<Common::WriteToConsoleListener> sVar3;
  
  if (instance()::inst == '\0') {
    iVar2 = __cxa_guard_acquire(&instance()::inst);
    in_RDX._M_pi = extraout_RDX;
    if (iVar2 != 0) {
      instance::inst.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)operator_new(0x30);
      ((instance::inst.
        super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_Listener)._vptr_Listener = (_func_int **)&PTR__WriteToConsoleListener_00106cf0;
      ((instance::inst.
        super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _mutex).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)
       ((long)&((instance::inst.
                 super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_mutex).super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)
       ((long)&((instance::inst.
                 super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
      ((instance::inst.
        super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      ((instance::inst.
        super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Common::WriteToConsoleListener*>
                (&instance::inst.
                  super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 instance::inst.
                 super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      __cxa_atexit(std::__shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&instance::inst,&__dso_handle);
      __cxa_guard_release(&instance()::inst);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  (in_RDI->super_Listener)._vptr_Listener =
       (_func_int **)
       instance::inst.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  _Var1 = instance::inst.
          super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  (in_RDI->_mutex).super___mutex_base._M_mutex.__align =
       (long)instance::inst.
             super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<Common::WriteToConsoleListener>)
         sVar3.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<WriteToConsoleListener> WriteToConsoleListener::instance()
{
    static auto inst = std::shared_ptr<WriteToConsoleListener>(new WriteToConsoleListener);
    return inst;
}